

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ParameterDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterDeclarationSyntax,slang::syntax::ParameterDeclarationSyntax_const&>
          (BumpAllocator *this,ParameterDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  ParameterDeclarationSyntax *pPVar9;
  
  pPVar9 = (ParameterDeclarationSyntax *)allocate(this,0x68,8);
  uVar4 = *(undefined4 *)&(args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode;
  TVar5 = (args->super_ParameterDeclarationBaseSyntax).keyword.kind;
  uVar6 = (args->super_ParameterDeclarationBaseSyntax).keyword.field_0x2;
  NVar7.raw = (args->super_ParameterDeclarationBaseSyntax).keyword.numFlags.raw;
  uVar8 = (args->super_ParameterDeclarationBaseSyntax).keyword.rawLen;
  (pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind =
       (args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent = pSVar1;
  (pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.kind = TVar5;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.field_0x2 = uVar6;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.numFlags = (NumericTokenFlags)NVar7.raw;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.rawLen = uVar8;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.info =
       (args->super_ParameterDeclarationBaseSyntax).keyword.info;
  (pPVar9->type).ptr = (args->type).ptr;
  (pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->declarators).super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar9->declarators).super_SyntaxListBase.childCount =
       (args->declarators).super_SyntaxListBase.childCount;
  (pPVar9->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00679648;
  sVar3 = (args->declarators).elements._M_extent._M_extent_value;
  (pPVar9->declarators).elements._M_ptr = (args->declarators).elements._M_ptr;
  (pPVar9->declarators).elements._M_extent._M_extent_value = sVar3;
  return pPVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }